

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O1

bool __thiscall QUrl::isParentOf(QUrl *this,QUrl *childUrl)

{
  int iVar1;
  QUrlPrivate *pQVar2;
  QUrlPrivate *pQVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  char16_t *pcVar9;
  long lVar10;
  QArrayData *pQVar11;
  QArrayData *unaff_R14;
  qsizetype qVar12;
  long in_FS_OFFSET;
  bool bVar13;
  QStringView rhs;
  QStringView rhs_00;
  QStringView lhs;
  QStringView lhs_00;
  QArrayData *local_d0;
  QString local_c0;
  QString local_a8;
  QString local_90;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  path(&local_58,childUrl,(ComponentFormattingOptions)0x7f00000);
  if (this->d == (QUrlPrivate *)0x0) {
    pQVar2 = childUrl->d;
    if (pQVar2 == (QUrlPrivate *)0x0) {
      qVar12 = 0;
      pQVar11 = (QArrayData *)0x0;
    }
    else {
      pQVar11 = &((pQVar2->scheme).d.d)->super_QArrayData;
      qVar12 = (pQVar2->scheme).d.size;
      if (pQVar11 != (QArrayData *)0x0) {
        LOCK();
        (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    if (((qVar12 == 0) &&
        (authority(&local_78,childUrl,(ComponentFormattingOptions)0x0),
        (undefined1 *)local_78.d.size == (undefined1 *)0x0)) &&
       ((undefined1 *)local_58.d.size != (undefined1 *)0x0)) {
      bVar8 = *local_58.d.ptr == L'/';
    }
    else {
      bVar8 = false;
    }
    if ((qVar12 == 0) && (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0)) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (pQVar11 == (QArrayData *)0x0) goto LAB_0026081c;
    LOCK();
    (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    iVar1 = (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
  }
  else {
    local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    path(&local_78,this,(ComponentFormattingOptions)0x7f00000);
    pQVar2 = childUrl->d;
    if (pQVar2 == (QUrlPrivate *)0x0) {
      lVar10 = 0;
      pQVar11 = (QArrayData *)0x0;
    }
    else {
      pQVar11 = &((pQVar2->scheme).d.d)->super_QArrayData;
      lVar10 = (pQVar2->scheme).d.size;
      if (pQVar11 != (QArrayData *)0x0) {
        LOCK();
        (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    bVar13 = lVar10 == 0;
    if (bVar13) {
LAB_00260624:
      authority(&local_90,childUrl,(ComponentFormattingOptions)0x0);
      bVar5 = local_90.d.size != 0;
      local_d0 = unaff_R14;
      if (local_90.d.size == 0) {
LAB_00260689:
        bVar8 = QString::startsWith(&local_58,&local_78,CaseSensitive);
        bVar7 = true;
        bVar6 = true;
        if (!bVar8) goto LAB_002606ef;
        bVar8 = QString::endsWith(&local_78,(QChar)0x2f,CaseSensitive);
        if ((bVar8) && (bVar8 = true, (ulong)local_78.d.size < (ulong)local_58.d.size)) {
          bVar6 = true;
        }
        else {
          bVar8 = QString::endsWith(&local_78,(QChar)0x2f,CaseSensitive);
          if ((bVar8) || ((ulong)local_58.d.size <= (ulong)local_78.d.size)) goto LAB_002606ef;
          bVar8 = local_58.d.ptr[local_78.d.size] == L'/';
        }
      }
      else {
        authority(&local_a8,this,(ComponentFormattingOptions)0x0);
        authority(&local_c0,childUrl,(ComponentFormattingOptions)0x0);
        bVar6 = true;
        if ((local_a8.d.size == local_c0.d.size) &&
           (rhs_00.m_data = local_c0.d.ptr, rhs_00.m_size = local_c0.d.size,
           lhs_00.m_data = local_a8.d.ptr, lhs_00.m_size = local_a8.d.size,
           bVar8 = QtPrivate::equalStrings(lhs_00,rhs_00), bVar8)) goto LAB_00260689;
        bVar8 = false;
        bVar5 = true;
      }
    }
    else {
      pQVar2 = this->d;
      pQVar3 = childUrl->d;
      if (pQVar3 == (QUrlPrivate *)0x0) {
        pcVar9 = (char16_t *)0x0;
        lVar10 = 0;
        unaff_R14 = (QArrayData *)0x0;
      }
      else {
        unaff_R14 = &((pQVar3->scheme).d.d)->super_QArrayData;
        pcVar9 = (pQVar3->scheme).d.ptr;
        lVar10 = (pQVar3->scheme).d.size;
        if (unaff_R14 != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&unaff_R14->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)&unaff_R14->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
      lVar4 = (pQVar2->scheme).d.size;
      if ((lVar4 == lVar10) &&
         (rhs.m_data = pcVar9, rhs.m_size = lVar10, lhs.m_data = (pQVar2->scheme).d.ptr,
         lhs.m_size = lVar4, bVar8 = QtPrivate::equalStrings(lhs,rhs), bVar8)) goto LAB_00260624;
      bVar13 = false;
      bVar5 = false;
      local_d0 = unaff_R14;
      bVar7 = false;
LAB_002606ef:
      bVar6 = bVar7;
      bVar8 = false;
    }
    if (bVar5) {
      if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((bVar6) && (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0)) {
      LOCK();
      ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (!(bool)(bVar13 | local_d0 == (QArrayData *)0x0)) {
      LOCK();
      (local_d0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_d0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_d0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_d0,2,0x10);
      }
    }
    if (pQVar11 != (QArrayData *)0x0) {
      LOCK();
      (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar11->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar11,2,0x10);
      }
    }
    if (&(local_78.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_0026081c;
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    iVar1 = ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    pQVar11 = &(local_78.d.d)->super_QArrayData;
  }
  if (iVar1 == 0) {
    QArrayData::deallocate(pQVar11,2,0x10);
  }
LAB_0026081c:
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool QUrl::isParentOf(const QUrl &childUrl) const
{
    QString childPath = childUrl.path();

    if (!d)
        return ((childUrl.scheme().isEmpty())
            && (childUrl.authority().isEmpty())
            && childPath.size() > 0 && childPath.at(0) == u'/');

    QString ourPath = path();

    return ((childUrl.scheme().isEmpty() || d->scheme == childUrl.scheme())
            && (childUrl.authority().isEmpty() || authority() == childUrl.authority())
            &&  childPath.startsWith(ourPath)
            && ((ourPath.endsWith(u'/') && childPath.size() > ourPath.size())
                || (!ourPath.endsWith(u'/') && childPath.size() > ourPath.size()
                    && childPath.at(ourPath.size()) == u'/')));
}